

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

bool __thiscall sentencepiece::SentencePieceText::IsInitialized(SentencePieceText *this)

{
  bool bVar1;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *in_RDI;
  ExtensionSet *in_stack_00000018;
  undefined1 local_1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(in_stack_00000018);
  if (bVar1) {
    bVar1 = google::protobuf::internal::
            AllAreInitialized<sentencepiece::SentencePieceText_SentencePiece>(in_RDI);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SentencePieceText::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  return true;
}